

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_match_head_string(char *str,char *pattern,size_t *matched_size)

{
  size_t *matched_size_local;
  char *pattern_local;
  char *str_local;
  
  *matched_size = 0;
  while( true ) {
    if (pattern[*matched_size] == '\0') {
      return '\x01';
    }
    if (str[*matched_size] == '\0') break;
    if (str[*matched_size] != pattern[*matched_size]) {
      return '\0';
    }
    *matched_size = *matched_size + 1;
  }
  return '\0';
}

Assistant:

static HTS_Boolean HTS_match_head_string(const char *str, const char *pattern, size_t * matched_size)
{

   (*matched_size) = 0;
   while (1) {
      if (pattern[(*matched_size)] == '\0')
         return TRUE;
      if (str[(*matched_size)] == '\0')
         return FALSE;
      if (str[(*matched_size)] != pattern[(*matched_size)])
         return FALSE;
      (*matched_size)++;
   }
}